

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O2

Vec_Int_t * Saig_MvManFindOscilators(Saig_MvMan_t *p,Vec_Int_t **pvConst0)

{
  int iFlop;
  int iVar1;
  Vec_Int_t *pVVar2;
  int i;
  Vec_Int_t *vBinary;
  
  pVVar2 = Saig_MvManFindConstBinaryFlops(p,&vBinary);
  *pvConst0 = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  for (i = 0; i < vBinary->nSize; i = i + 1) {
    iFlop = Vec_IntEntry(vBinary,i);
    iVar1 = Saig_MvManCheckOscilator(p,iFlop);
    if (iVar1 != 0) {
      Vec_IntPush(pVVar2,iFlop);
    }
  }
  Vec_IntFree(vBinary);
  return pVVar2;
}

Assistant:

Vec_Int_t * Saig_MvManFindOscilators( Saig_MvMan_t * p, Vec_Int_t ** pvConst0 )
{
    Vec_Int_t * vBinary, * vOscils;
    int Entry, i;
    // detect constant flops
    *pvConst0 = Saig_MvManFindConstBinaryFlops( p, &vBinary );
    // check binary flops
    vOscils = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vBinary, Entry, i )
        if ( Saig_MvManCheckOscilator( p, Entry ) )
            Vec_IntPush( vOscils, Entry );
    Vec_IntFree( vBinary );
    return vOscils;
}